

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

string * __thiscall obx::Tree::getLeafName(string *__return_storage_ptr__,Tree *this,string *path)

{
  long lVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::rfind((char)path,(ulong)(uint)(int)(char)this[8]);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)path);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tree::getLeafName(const std::string& path) const {
    std::string leafName;
    auto lastDelimiter = path.find_last_of(pathDelimiter_);
    if (lastDelimiter == std::string ::npos) {
        leafName = path;
    } else {
        leafName = path.substr(lastDelimiter + 1);
    }
    return leafName;
}